

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O2

void __thiscall
flow::UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2>::UnaryInstr
          (UnaryInstr<(flow::UnaryOperator)3,_(flow::LiteralType)2> *this,Value *op,string *name)

{
  initializer_list<flow::Value_*> __l;
  allocator_type local_39;
  Value *local_38;
  _Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_> local_30;
  
  __l._M_len = 1;
  __l._M_array = &local_38;
  local_38 = op;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector
            ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_30,__l,&local_39);
  Instr::Instr(&this->super_Instr,Number,
               (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_30,name);
  std::_Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>::~_Vector_base(&local_30);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__Instr_0019be10;
  this->operator_ = SLen;
  return;
}

Assistant:

UnaryInstr(Value* op, const std::string& name)
      : Instr(ResultType, {op}, name), operator_(Operator) {}